

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O3

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::convertCase_pcp<axl::enc::ToUpperCase>
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this)

{
  C *p0;
  C *pCVar1;
  C *pCVar2;
  StringRef src;
  UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap> local_48;
  CountingEmitter local_40;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_30;
  
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (&local_30,&this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
  p0 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p;
  local_40.m_length = 0;
  local_40.m_replacement = 0xfffd;
  local_48.m_state = 0;
  local_48.m_cp = 0;
  enc::Utf8Decoder::
  decodeImpl<axl::enc::Convert<axl::enc::Utf8,axl::enc::Utf8,axl::enc::ToUpperCase,axl::enc::Utf8Decoder>::CountingEmitter>
            ((Dfa *)&local_48,&local_40,p0,
             p0 + (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length);
  pCVar2 = (C *)local_40.m_length;
  pCVar1 = createBuffer(this,local_40.m_length,false);
  if (pCVar1 == (C *)0x0) {
    pCVar2 = (C *)0xffffffffffffffff;
  }
  else {
    local_40.m_replacement = 0xfffd;
    local_48.m_state = 0;
    local_48.m_cp = 0;
    local_40.m_length = (size_t)pCVar1;
    enc::Utf8Decoder::
    decodeImpl<axl::enc::Convert<axl::enc::Utf8,axl::enc::Utf8,axl::enc::ToUpperCase,axl::enc::Utf8Decoder>::EncodingEmitter_u>
              ((Dfa *)&local_48,(EncodingEmitter_u *)&local_40,local_30.m_p,
               local_30.m_p + local_30.m_length);
  }
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_30);
  return (size_t)pCVar2;
}

Assistant:

size_t
	convertCase_pcp() {
		StringRef src = *this; // save old contents -- can't convert in-place because length can increase

		size_t length = enc::Convert<Encoding, Encoding, CaseOp>::calcRequiredLength(this->m_p, this->m_p + this->m_length);
		C* p = createBuffer(length);
		if (!p)
			return -1;

		enc::Convert<Encoding, Encoding, CaseOp>::convert_u(p, src.cp(), src.getEnd());
		return length;
	}